

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cpp
# Opt level: O1

void __thiscall xercesc_4_0::Match::setNoGroups(Match *this,int n)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  
  if ((this->fNoGroups < 1) || (this->fPositionsSize < n)) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fStartPositions);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEndPositions);
    this->fStartPositions = (int *)0x0;
    this->fEndPositions = (int *)0x0;
    this->fPositionsSize = n;
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(long)n << 2);
    this->fStartPositions = (int *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(long)n << 2);
    this->fEndPositions = (int *)CONCAT44(extraout_var_00,iVar3);
  }
  this->fNoGroups = n;
  if (0 < this->fPositionsSize) {
    piVar1 = this->fStartPositions;
    piVar2 = this->fEndPositions;
    lVar4 = 0;
    do {
      piVar1[lVar4] = -1;
      piVar2[lVar4] = -1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->fPositionsSize);
  }
  return;
}

Assistant:

void Match::setNoGroups(const int n) {

    if (fNoGroups <= 0 || fPositionsSize < n) {

        cleanUp();
        fPositionsSize = n;
        fStartPositions = (int*) fMemoryManager->allocate(n * sizeof(int));//new int[n];
        fEndPositions = (int*) fMemoryManager->allocate(n * sizeof(int));//new int[n];
    }

    fNoGroups = n;

    for (int i=0; i< fPositionsSize; i++) {

        fStartPositions[i] = -1;
        fEndPositions[i] = -1;
    }
}